

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.hpp
# Opt level: O1

void __thiscall Item::~Item(Item *this)

{
  ~Item(this);
  operator_delete(this,0x100);
  return;
}

Assistant:

virtual ~Item() {}